

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::Program::Clear(Program *this)

{
  string *psVar1;
  
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
  ::clear(&(this->functions_).map_);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::clear(&(this->attributes_).map_);
  psVar1 = (this->docstring_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  this->version_ = 0;
  return;
}

Assistant:

void Program::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Program)
  functions_.Clear();
  attributes_.Clear();
  docstring_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  version_ = GOOGLE_LONGLONG(0);
}